

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::OnCallSpec<test_result_(long_long)>::OnCallSpec
          (OnCallSpec<test_result_(long_long)> *this,char *a_file,int a_line,
          ArgumentMatcherTuple *matchers)

{
  int in_EDX;
  char *in_RSI;
  UntypedOnCallSpecBase *in_RDI;
  
  UntypedOnCallSpecBase::UntypedOnCallSpecBase(in_RDI,in_RSI,in_EDX);
  std::tr1::tuple<testing::Matcher<long_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  ::tuple((tuple<testing::Matcher<long_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
           *)in_RDI,
          (tuple<testing::Matcher<long_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
           *)(in_RDI + 1));
  A<std::tr1::tuple<long_long,void,void,void,void,void,void,void,void,void>const&>();
  Action<test_result_(long_long)>::Action((Action<test_result_(long_long)> *)0x1527a9);
  return;
}

Assistant:

OnCallSpec(const char* a_file, int a_line,
             const ArgumentMatcherTuple& matchers)
      : UntypedOnCallSpecBase(a_file, a_line),
        matchers_(matchers),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()) {
  }